

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorNinePatchInstancer::InstanceDecorator
          (DecoratorNinePatchInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  Spritesheet *pSVar1;
  element_type *this_00;
  bool bVar2;
  Property *pPVar3;
  NumericValue NVar4;
  Sprite *_rect_outer;
  Sprite *_rect_inner;
  RenderManager *render_manager;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Array<NumericValue,_4> *_edges;
  DecoratorInstancerInterface *in_R8;
  int i;
  long lVar6;
  SharedPtr<Decorator> SVar7;
  Texture _texture;
  SharedPtr<Rml::DecoratorNinePatch> decorator;
  Array<NumericValue,_4> edges;
  
  edges._M_elems[2].number = 0.0;
  edges._M_elems[2].unit = UNKNOWN;
  edges._M_elems[3].number = 0.0;
  edges._M_elems[3].unit = UNKNOWN;
  edges._M_elems[0].number = 0.0;
  edges._M_elems[0].unit = UNKNOWN;
  edges._M_elems[1].number = 0.0;
  edges._M_elems[1].unit = UNKNOWN;
  bVar2 = false;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    pPVar3 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)instancer_interface,
                        param_1[3].field_2._M_local_buf[lVar6 + 10]);
    NVar4 = Property::GetNumericValue(pPVar3);
    edges._M_elems[lVar6] = NVar4;
    bVar2 = (bool)(bVar2 | ((ulong)NVar4 & 0x7fffffff) != 0);
  }
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)instancer_interface,param_1[3].field_2._M_local_buf[8]);
  Property::Get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&decorator,pPVar3)
  ;
  _rect_outer = DecoratorInstancerInterface::GetSprite(in_R8,(String *)&decorator);
  if (_rect_outer == (Sprite *)0x0) {
    Log::Message(LT_WARNING,"Could not find sprite named \'%s\' in ninepatch decorator.",
                 decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
  }
  else {
    ::std::__cxx11::string::~string((string *)&decorator);
    pPVar3 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)instancer_interface,param_1[3].field_2._M_local_buf[9]
                       );
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&decorator,
               pPVar3);
    _rect_inner = DecoratorInstancerInterface::GetSprite(in_R8,(String *)&decorator);
    if (_rect_inner != (Sprite *)0x0) {
      ::std::__cxx11::string::~string((string *)&decorator);
      if (_rect_outer->sprite_sheet == _rect_inner->sprite_sheet) {
        ::std::make_shared<Rml::DecoratorNinePatch>();
        this_00 = decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        _edges = &edges;
        if (!bVar2) {
          _edges = (Array<NumericValue,_4> *)0x0;
        }
        pSVar1 = _rect_outer->sprite_sheet;
        render_manager = DecoratorInstancerInterface::GetRenderManager(in_R8);
        _texture = TextureSource::GetTexture(&pSVar1->texture_source,render_manager);
        bVar2 = DecoratorNinePatch::Initialise
                          (this_00,&_rect_outer->rectangle,&_rect_inner->rectangle,_edges,_texture,
                           _rect_outer->sprite_sheet->display_scale);
        _Var5 = decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        if (bVar2) {
          decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
               (_func_int **)
               decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var5._M_pi;
          decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        else {
          (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&decorator.
                    super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Var5._M_pi = extraout_RDX_01;
      }
      else {
        Log::Message(LT_WARNING,
                     "The outer and inner sprites in a ninepatch decorator must be from the same sprite sheet."
                    );
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var5._M_pi = extraout_RDX;
      }
      goto LAB_002778e9;
    }
    Log::Message(LT_WARNING,"Could not find sprite named \'%s\' in ninepatch decorator.",
                 decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
  }
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::__cxx11::string::~string((string *)&decorator);
  _Var5._M_pi = extraout_RDX_00;
LAB_002778e9:
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorNinePatchInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	bool edges_set = false;
	Array<NumericValue, 4> edges;
	for (int i = 0; i < 4; i++)
	{
		edges[i] = properties.GetProperty(edge_ids[i])->GetNumericValue();
		if (edges[i].number != 0.0f)
		{
			edges_set = true;
		}
	}

	const Sprite* sprite_outer = nullptr;
	const Sprite* sprite_inner = nullptr;

	{
		const String sprite_name = properties.GetProperty(sprite_outer_id)->Get<String>();
		sprite_outer = instancer_interface.GetSprite(sprite_name);
		if (!sprite_outer)
		{
			Log::Message(Log::LT_WARNING, "Could not find sprite named '%s' in ninepatch decorator.", sprite_name.c_str());
			return nullptr;
		}
	}
	{
		const String sprite_name = properties.GetProperty(sprite_inner_id)->Get<String>();
		sprite_inner = instancer_interface.GetSprite(sprite_name);
		if (!sprite_inner)
		{
			Log::Message(Log::LT_WARNING, "Could not find sprite named '%s' in ninepatch decorator.", sprite_name.c_str());
			return nullptr;
		}
	}

	if (sprite_outer->sprite_sheet != sprite_inner->sprite_sheet)
	{
		Log::Message(Log::LT_WARNING, "The outer and inner sprites in a ninepatch decorator must be from the same sprite sheet.");
		return nullptr;
	}

	auto decorator = MakeShared<DecoratorNinePatch>();

	if (!decorator->Initialise(sprite_outer->rectangle, sprite_inner->rectangle, (edges_set ? &edges : nullptr),
			sprite_outer->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager()), sprite_outer->sprite_sheet->display_scale))
	{
		return nullptr;
	}

	return decorator;
}